

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local.cpp
# Opt level: O0

HLOCAL LocalFree(HLOCAL hMem)

{
  HANDLE hHeap;
  HLOCAL local_20;
  int local_14;
  BOOL bRetVal;
  HLOCAL hMem_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (hMem == (HLOCAL)0x0) {
    local_14 = 1;
  }
  else {
    hHeap = GetProcessHeap();
    local_14 = HeapFree(hHeap,0,hMem);
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  local_20 = hMem;
  if (local_14 == 1) {
    local_20 = (HLOCAL)0x0;
  }
  return local_20;
}

Assistant:

HLOCAL
PALAPI
LocalFree(
	  IN HLOCAL hMem)
{
    BOOL bRetVal = FALSE;
    PERF_ENTRY(LocalFree);
    ENTRY("LocalFree (hmem=%p)\n", hMem);

    if ( hMem )
    {
        bRetVal = HeapFree( GetProcessHeap(), 0, hMem );
    }
    else
    {
        bRetVal = TRUE;
    }
    
    LOGEXIT( "LocalFree returning %p.\n", bRetVal == TRUE ? (HLOCAL)NULL : hMem );
    PERF_EXIT(LocalFree);
    return bRetVal == TRUE ? (HLOCAL)NULL : hMem;
}